

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SolveBeforeConstraintSyntax::setChild
          (SolveBeforeConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *pSVar2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 5) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->solve).kind = TVar4.kind;
      (this->solve).field_0x2 = TVar4._2_1_;
      (this->solve).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->solve).rawLen = TVar4.rawLen;
      (this->solve).info = TVar4.info;
      break;
    case 1:
      pSVar2 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                         (pSVar2);
      (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->beforeExpr).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->beforeExpr).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount
      ;
      sVar1 = (pSVar3->elements).size_;
      (this->beforeExpr).elements.data_ = (pSVar3->elements).data_;
      (this->beforeExpr).elements.size_ = sVar1;
      break;
    case 2:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->before).kind = TVar4.kind;
      (this->before).field_0x2 = TVar4._2_1_;
      (this->before).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->before).rawLen = TVar4.rawLen;
      (this->before).info = TVar4.info;
      break;
    case 3:
      pSVar2 = TokenOrSyntax::node(&child);
      pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                         (pSVar2);
      (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->afterExpr).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->afterExpr).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
      sVar1 = (pSVar3->elements).size_;
      (this->afterExpr).elements.data_ = (pSVar3->elements).data_;
      (this->afterExpr).elements.size_ = sVar1;
      break;
    case 4:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar4.kind;
      (this->semi).field_0x2 = TVar4._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->semi).rawLen = TVar4.rawLen;
      (this->semi).info = TVar4.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x2ea5);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SolveBeforeConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: solve = child.token(); return;
        case 1: beforeExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 2: before = child.token(); return;
        case 3: afterExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}